

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dsdTree.c
# Opt level: O0

void Dsd_TreeCollectNodesDfs_rec(Dsd_Node_t *pNode,Dsd_Node_t **ppNodes,int *pnNodes)

{
  short sVar1;
  int iVar2;
  int local_24;
  int i;
  int *pnNodes_local;
  Dsd_Node_t **ppNodes_local;
  Dsd_Node_t *pNode_local;
  
  if (pNode == (Dsd_Node_t *)0x0) {
    __assert_fail("pNode",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/bdd/dsd/dsdTree.c"
                  ,0x266,"void Dsd_TreeCollectNodesDfs_rec(Dsd_Node_t *, Dsd_Node_t **, int *)");
  }
  if (((ulong)pNode & 1) != 0) {
    __assert_fail("!Dsd_IsComplement(pNode)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/bdd/dsd/dsdTree.c"
                  ,0x267,"void Dsd_TreeCollectNodesDfs_rec(Dsd_Node_t *, Dsd_Node_t **, int *)");
  }
  if (pNode->nVisits < 0) {
    __assert_fail("pNode->nVisits >= 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/bdd/dsd/dsdTree.c"
                  ,0x268,"void Dsd_TreeCollectNodesDfs_rec(Dsd_Node_t *, Dsd_Node_t **, int *)");
  }
  sVar1 = pNode->nVisits;
  pNode->nVisits = sVar1 + 1;
  if ((sVar1 == 0) && (1 < pNode->nDecs)) {
    for (local_24 = 0; local_24 < pNode->nDecs; local_24 = local_24 + 1) {
      Dsd_TreeCollectNodesDfs_rec
                ((Dsd_Node_t *)((ulong)pNode->pDecs[local_24] & 0xfffffffffffffffe),ppNodes,pnNodes)
      ;
    }
    iVar2 = *pnNodes;
    *pnNodes = iVar2 + 1;
    ppNodes[iVar2] = pNode;
  }
  return;
}

Assistant:

void Dsd_TreeCollectNodesDfs_rec( Dsd_Node_t * pNode, Dsd_Node_t * ppNodes[], int * pnNodes )
{
    int i;
    assert( pNode );
    assert( !Dsd_IsComplement(pNode) );
    assert( pNode->nVisits >= 0 );

    if ( pNode->nVisits++ ) // if this is not the first visit, return zero
        return;
    if ( pNode->nDecs <= 1 )
        return;

    // upon the first visit, go through the list of successors and call recursively 
    for ( i = 0; i < pNode->nDecs; i++ )
        Dsd_TreeCollectNodesDfs_rec( Dsd_Regular(pNode->pDecs[i]), ppNodes, pnNodes );

    ppNodes[ (*pnNodes)++ ] = pNode;
}